

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallTargetGenerator.cxx
# Opt level: O3

Files * __thiscall
cmInstallTargetGenerator::GetFiles
          (Files *__return_storage_ptr__,cmInstallTargetGenerator *this,string *config)

{
  NamelinkModeType namelinkMode;
  cmGeneratorTarget *this_00;
  bool bVar1;
  cmInstallType cVar2;
  int iVar3;
  cmLocalGenerator *pcVar4;
  string *psVar5;
  undefined8 *puVar6;
  cmMakefile *this_01;
  cmValue cVar7;
  cmGlobalGenerator *pcVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  _Alloc_hider _Var12;
  string *obj;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  string to1;
  string to1_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  objects;
  string to2;
  string fromDirConfig;
  Names targetNames;
  string local_238;
  string local_218;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e8;
  undefined1 *local_1d8;
  undefined8 local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  string local_1a8;
  Names local_188;
  undefined1 local_88 [24];
  code *pcStack_70;
  bool local_68;
  _Optional_payload_base<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
  local_58;
  
  (__return_storage_ptr__->To).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->To).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->From).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->To).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->From).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->From).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->FromDir)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->FromDir).field_2;
  (__return_storage_ptr__->FromDir)._M_string_length = 0;
  (__return_storage_ptr__->FromDir).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->ToDir)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->ToDir).field_2;
  (__return_storage_ptr__->ToDir)._M_string_length = 0;
  (__return_storage_ptr__->ToDir).field_2._M_local_buf[0] = '\0';
  __return_storage_ptr__->NamelinkMode = NamelinkModeNone;
  __return_storage_ptr__->NoTweak = false;
  __return_storage_ptr__->UseSourcePermissions = false;
  __return_storage_ptr__->Type = cmInstallType_EXECUTABLE;
  cVar2 = cmGeneratorTarget::GetType(this->Target);
  switch(cVar2) {
  case cmInstallType_EXECUTABLE:
  case cmInstallType_STATIC_LIBRARY:
  case cmInstallType_SHARED_LIBRARY:
  case cmInstallType_MODULE_LIBRARY:
    __return_storage_ptr__->Type = cVar2;
    break;
  case cmInstallType_FILES:
    local_1f8._M_allocated_capacity = 0;
    local_1f8._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_1e8._M_allocated_capacity = 0;
    cmGeneratorTarget::GetTargetObjectNames
              (this->Target,config,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_1f8);
    __return_storage_ptr__->Type = cmInstallType_FILES;
    __return_storage_ptr__->NoTweak = true;
    cmGeneratorTarget::GetObjectDirectory(&local_188.Base,this->Target,config);
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->FromDir,(string *)&local_188)
    ;
    paVar9 = &local_188.Base.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188.Base._M_dataplus._M_p != paVar9) {
      operator_delete(local_188.Base._M_dataplus._M_p,
                      (ulong)(local_188.Base.field_2._M_allocated_capacity + 1));
    }
    anon_unknown.dwarf_272cc62::computeInstallObjectDir(&local_188.Base,this->Target,config);
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->ToDir,(string *)&local_188);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188.Base._M_dataplus._M_p != paVar9) {
      operator_delete(local_188.Base._M_dataplus._M_p,
                      (ulong)(local_188.Base.field_2._M_allocated_capacity + 1));
    }
    uVar10 = local_1f8._8_8_;
    if (local_1f8._M_allocated_capacity != local_1f8._8_8_) {
      uVar11 = local_1f8._M_allocated_capacity;
      do {
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string&>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   __return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)uVar11);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &__return_storage_ptr__->To,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)uVar11);
        uVar11 = uVar11 + 0x20;
      } while (uVar11 != uVar10);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_1f8);
    return __return_storage_ptr__;
  case cmInstallType_PROGRAMS:
  case cmInstallType_DIRECTORY:
  case 8:
    pcVar4 = cmGeneratorTarget::GetLocalGenerator(this->Target);
    paVar9 = &local_188.Base.field_2;
    local_188.Base._M_dataplus._M_p = (pointer)paVar9;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_188,"cmInstallTargetGenerator created with non-installable target.",
               "");
    cmLocalGenerator::IssueMessage(pcVar4,INTERNAL_ERROR,&local_188.Base);
    uVar10 = local_188.Base.field_2._M_allocated_capacity;
    _Var12._M_p = local_188.Base._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188.Base._M_dataplus._M_p == paVar9) {
      return __return_storage_ptr__;
    }
    goto LAB_005c739b;
  case cmInstallType_DIRECTORY|cmInstallType_STATIC_LIBRARY:
    __assert_fail("false && \"INTERFACE_LIBRARY targets have no installable outputs.\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmInstallTargetGenerator.cxx"
                  ,0xdf,
                  "cmInstallTargetGenerator::Files cmInstallTargetGenerator::GetFiles(const std::string &) const"
                 );
  }
  local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
  local_1a8._M_string_length = 0;
  local_1a8.field_2._M_local_buf[0] = '\0';
  bVar1 = cmGeneratorTarget::NeedRelinkBeforeInstall(this->Target,config);
  if (bVar1) {
    pcVar4 = cmGeneratorTarget::GetLocalGenerator(this->Target);
    psVar5 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(pcVar4);
    local_188.Base._M_string_length = (size_type)(psVar5->_M_dataplus)._M_p;
    local_188.Base._M_dataplus._M_p = (pointer)psVar5->_M_string_length;
    local_188.Base.field_2._M_allocated_capacity = 0;
    local_188.Base.field_2._8_8_ = 0x1c;
    local_188.Output._M_dataplus._M_p = "/CMakeFiles/CMakeRelink.dir/";
    local_188.Output._M_string_length = 0;
    views._M_len = 2;
    views._M_array = (iterator)&local_188;
    cmCatViews((string *)&local_1f8,views);
    std::__cxx11::string::operator=((string *)&local_1a8,(string *)local_1f8._M_local_buf);
    uVar10 = local_1e8._M_allocated_capacity;
    uVar11 = local_1f8._M_allocated_capacity;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_allocated_capacity != &local_1e8) {
LAB_005c6db7:
      operator_delete((void *)uVar11,(ulong)((long)&(((string *)uVar10)->_M_dataplus)._M_p + 1));
    }
  }
  else {
    cmGeneratorTarget::GetDirectory(&local_218,this->Target,config,(uint)this->ImportLibrary);
    local_1f8._M_allocated_capacity = local_218._M_string_length;
    local_1f8._8_8_ = local_218._M_dataplus._M_p;
    local_1d8 = (undefined1 *)((long)&local_188.Base.field_2 + 8);
    local_188.Base._M_dataplus._M_p = (pointer)0x0;
    local_188.Base._M_string_length = 1;
    local_188.Base.field_2._M_local_buf[8] = 0x2f;
    local_1e8._8_8_ = 1;
    local_1d0 = 0;
    views_00._M_len = 2;
    views_00._M_array = (iterator)&local_1f8;
    local_1e8._M_allocated_capacity = (size_type)&local_218;
    local_188.Base.field_2._M_allocated_capacity = (size_type)local_1d8;
    cmCatViews(&local_238,views_00);
    std::__cxx11::string::operator=((string *)&local_1a8,(string *)&local_238);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != &local_238.field_2) {
      operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      uVar10 = (string *)
               CONCAT71(local_218.field_2._M_allocated_capacity._1_7_,
                        local_218.field_2._M_local_buf[0]);
      uVar11 = local_218._M_dataplus._M_p;
      goto LAB_005c6db7;
    }
  }
  if (cVar2 == cmInstallType_EXECUTABLE) {
    if (this->NamelinkMode != NamelinkModeNone) {
      __assert_fail("this->NamelinkMode == NamelinkModeNone",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmInstallTargetGenerator.cxx"
                    ,0x10b,
                    "cmInstallTargetGenerator::Files cmInstallTargetGenerator::GetFiles(const std::string &) const"
                   );
    }
    cmGeneratorTarget::GetExecutableNames(&local_188,this->Target,config);
    if (this->ImportLibrary == true) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1f8
                     ,&local_1a8,&local_188.ImportLibrary);
      local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_238,local_188.ImportLibrary._M_dataplus._M_p,
                 local_188.ImportLibrary._M_dataplus._M_p + local_188.ImportLibrary._M_string_length
                );
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 __return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1f8);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &__return_storage_ptr__->To,&local_238);
      local_218._M_string_length = 0;
      local_218.field_2._M_local_buf[0] = '\0';
      local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
      bVar1 = cmGeneratorTarget::GetImplibGNUtoMS
                        (this->Target,config,&local_188.ImportLibrary,&local_218,(char *)0x0);
      if (bVar1) {
        std::operator+(&local_1c8,&local_1a8,&local_218);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   __return_storage_ptr__,&local_1c8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
          operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
        }
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string&>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &__return_storage_ptr__->To,&local_218);
      }
      __return_storage_ptr__->Type = cmInstallType_STATIC_LIBRARY;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != &local_218.field_2) {
        operator_delete(local_218._M_dataplus._M_p,
                        CONCAT71(local_218.field_2._M_allocated_capacity._1_7_,
                                 local_218.field_2._M_local_buf[0]) + 1);
      }
LAB_005c7334:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
LAB_005c7339:
        operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1f8
                     ,&local_1a8,&local_188.Output);
      local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_238,local_188.Output._M_dataplus._M_p,
                 local_188.Output._M_dataplus._M_p + local_188.Output._M_string_length);
      bVar1 = cmGeneratorTarget::IsAppBundleOnApple(this->Target);
      if (bVar1) {
        this_01 = cmTarget::GetMakefile(this->Target->Target);
        local_218._M_string_length = 0;
        local_218.field_2._M_local_buf[0] = '\0';
        this_00 = this->Target;
        local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
        local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"BUNDLE_EXTENSION","");
        cVar7 = cmGeneratorTarget::GetProperty(this_00,&local_1c8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
          operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
        }
        if (cVar7.Value == (string *)0x0) {
          std::__cxx11::string::_M_replace
                    ((ulong)&local_218,0,(char *)local_218._M_string_length,0x8b067e);
        }
        else {
          std::__cxx11::string::_M_assign((string *)&local_218);
        }
        __return_storage_ptr__->Type = cmInstallType_DIRECTORY;
        __return_storage_ptr__->UseSourcePermissions = true;
        std::__cxx11::string::append(local_1f8._M_local_buf);
        std::__cxx11::string::_M_append(local_1f8._M_local_buf,(ulong)local_218._M_dataplus._M_p);
        std::__cxx11::string::append((char *)&local_238);
        std::__cxx11::string::_M_append((char *)&local_238,(ulong)local_218._M_dataplus._M_p);
        std::__cxx11::string::append((char *)&local_238);
        bVar1 = cmMakefile::PlatformIsAppleEmbedded(this_01);
        if (!bVar1) {
          std::__cxx11::string::append((char *)&local_238);
        }
        std::__cxx11::string::_M_append((char *)&local_238,(ulong)local_188.Output._M_dataplus._M_p)
        ;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_218._M_dataplus._M_p != &local_218.field_2) {
          operator_delete(local_218._M_dataplus._M_p,
                          CONCAT71(local_218.field_2._M_allocated_capacity._1_7_,
                                   local_218.field_2._M_local_buf[0]) + 1);
        }
      }
      else if ((local_188.Real._M_string_length != local_188.Output._M_string_length) ||
              ((local_188.Real._M_string_length != 0 &&
               (iVar3 = bcmp(local_188.Real._M_dataplus._M_p,local_188.Output._M_dataplus._M_p,
                             local_188.Real._M_string_length), iVar3 != 0)))) {
        std::operator+(&local_218,&local_1a8,&local_188.Real);
        local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1c8,local_188.Real._M_dataplus._M_p,
                   local_188.Real._M_dataplus._M_p + local_188.Real._M_string_length);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   __return_storage_ptr__,&local_218);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &__return_storage_ptr__->To,&local_1c8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
          operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_218._M_dataplus._M_p != &local_218.field_2) {
          operator_delete(local_218._M_dataplus._M_p,
                          CONCAT71(local_218.field_2._M_allocated_capacity._1_7_,
                                   local_218.field_2._M_local_buf[0]) + 1);
        }
      }
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 __return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1f8);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &__return_storage_ptr__->To,&local_238);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) goto LAB_005c7339;
    }
LAB_005c7346:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_allocated_capacity != &local_1e8) {
      operator_delete((void *)local_1f8._M_allocated_capacity,
                      (ulong)(local_1e8._M_allocated_capacity + 1));
    }
LAB_005c7361:
    cmGeneratorTarget::Names::~Names(&local_188);
    if ((long)(__return_storage_ptr__->From).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(__return_storage_ptr__->From).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start !=
        (long)(__return_storage_ptr__->To).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(__return_storage_ptr__->To).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
      __assert_fail("files.From.size() == files.To.size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmInstallTargetGenerator.cxx"
                    ,0x19e,
                    "cmInstallTargetGenerator::Files cmInstallTargetGenerator::GetFiles(const std::string &) const"
                   );
    }
  }
  else {
    cmGeneratorTarget::GetLibraryNames(&local_188,this->Target,config);
    if (this->ImportLibrary == true) {
      bVar1 = cmMakefile::PlatformSupportsAppleTextStubs(this->Target->Makefile);
      namelinkMode = this->ImportlinkMode;
      if (!bVar1 && namelinkMode != NamelinkModeNone) {
        __assert_fail("this->Target->Makefile->PlatformSupportsAppleTextStubs() || this->ImportlinkMode == NamelinkModeNone"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmInstallTargetGenerator.cxx"
                      ,0x14e,
                      "cmInstallTargetGenerator::Files cmInstallTargetGenerator::GetFiles(const std::string &) const"
                     );
      }
      local_88._16_8_ = (_Manager_type)0x0;
      pcStack_70 = (_Invoker_type)0x0;
      local_88._0_8_ = 0;
      local_88._8_8_ = 0;
      local_88._0_8_ = operator_new(0x20);
      *(cmInstallTargetGenerator **)local_88._0_8_ = this;
      *(string **)(local_88._0_8_ + 8) = config;
      *(Files **)(local_88._0_8_ + 0x10) = __return_storage_ptr__;
      *(string **)(local_88._0_8_ + 0x18) = &local_1a8;
      pcStack_70 = std::
                   _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmInstallTargetGenerator.cxx:336:22)>
                   ::_M_invoke;
      local_88._16_8_ =
           std::
           _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmInstallTargetGenerator.cxx:336:22)>
           ::_M_manager;
      local_68 = true;
      anon_unknown.dwarf_272cc62::computeFilesToInstall
                (__return_storage_ptr__,namelinkMode,&local_1a8,&local_188.ImportOutput,
                 &local_188.ImportLibrary,&local_188.ImportReal,
                 (optional<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
                  *)local_88);
      std::
      _Optional_payload_base<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
      ::_M_reset((_Optional_payload_base<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
                  *)local_88);
      __return_storage_ptr__->Type = cmInstallType_STATIC_LIBRARY;
      goto LAB_005c7361;
    }
    bVar1 = cmGeneratorTarget::IsFrameworkOnApple(this->Target);
    if (!bVar1) {
      bVar1 = cmGeneratorTarget::IsCFBundleOnApple(this->Target);
      if (bVar1) {
        __return_storage_ptr__->Type = cmInstallType_DIRECTORY;
        __return_storage_ptr__->UseSourcePermissions = true;
        std::__cxx11::string::find((char)&local_188.Output,0x2f);
        std::__cxx11::string::substr((ulong)&local_1f8,(ulong)&local_188.Output);
        std::operator+(&local_238,&local_1a8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1f8);
        local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_218,local_188.Output._M_dataplus._M_p,
                   local_188.Output._M_dataplus._M_p + local_188.Output._M_string_length);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   __return_storage_ptr__,&local_238);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &__return_storage_ptr__->To,&local_218);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_218._M_dataplus._M_p != &local_218.field_2) {
          operator_delete(local_218._M_dataplus._M_p,
                          CONCAT71(local_218.field_2._M_allocated_capacity._1_7_,
                                   local_218.field_2._M_local_buf[0]) + 1);
        }
        goto LAB_005c7334;
      }
      local_58._M_engaged = false;
      anon_unknown.dwarf_272cc62::computeFilesToInstall
                (__return_storage_ptr__,this->NamelinkMode,&local_1a8,&local_188.Output,
                 &local_188.SharedObject,&local_188.Real,
                 (optional<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
                  *)&local_58);
      std::
      _Optional_payload_base<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
      ::_M_reset(&local_58);
      goto LAB_005c7361;
    }
    if (this->NamelinkMode != NamelinkModeOnly) {
      if (this->NamelinkMode == NamelinkModeSkip) {
        psVar5 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
        std::operator+(&local_238,"Target \'",psVar5);
        puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_238);
        paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(puVar6 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar6 == paVar9) {
          local_1e8._M_allocated_capacity = paVar9->_M_allocated_capacity;
          local_1e8._8_8_ = puVar6[3];
          local_1f8._M_allocated_capacity = (size_type)&local_1e8;
        }
        else {
          local_1e8._M_allocated_capacity = paVar9->_M_allocated_capacity;
          local_1f8._M_allocated_capacity =
               (size_type)
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*puVar6;
        }
        local_1f8._8_8_ = puVar6[1];
        *puVar6 = paVar9;
        puVar6[1] = 0;
        *(undefined1 *)(puVar6 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._M_dataplus._M_p != &local_238.field_2) {
          operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
        }
        pcVar8 = cmGeneratorTarget::GetGlobalGenerator(this->Target);
        cmake::IssueMessage(pcVar8->CMakeInstance,AUTHOR_WARNING,(string *)&local_1f8,
                            &(this->super_cmInstallGenerator).Backtrace);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8._M_allocated_capacity != &local_1e8) {
          operator_delete((void *)local_1f8._M_allocated_capacity,
                          (ulong)(local_1e8._M_allocated_capacity + 1));
        }
      }
      __return_storage_ptr__->Type = cmInstallType_DIRECTORY;
      __return_storage_ptr__->UseSourcePermissions = true;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1f8
                     ,&local_1a8,&local_188.Output);
      cmsys::SystemTools::GetFilenamePath(&local_238,(string *)&local_1f8);
      std::__cxx11::string::operator=((string *)local_1f8._M_local_buf,(string *)&local_238);
      paVar9 = &local_238.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != paVar9) {
        operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
      }
      local_238._M_dataplus._M_p = (pointer)paVar9;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_238,local_188.Real._M_dataplus._M_p,
                 local_188.Real._M_dataplus._M_p + local_188.Real._M_string_length);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 __return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1f8);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &__return_storage_ptr__->To,&local_238);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != paVar9) goto LAB_005c7339;
      goto LAB_005c7346;
    }
    cmGeneratorTarget::Names::~Names(&local_188);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
    uVar10 = (undefined1 *)
             CONCAT71(local_1a8.field_2._M_allocated_capacity._1_7_,
                      local_1a8.field_2._M_local_buf[0]);
    _Var12._M_p = local_1a8._M_dataplus._M_p;
LAB_005c739b:
    operator_delete(_Var12._M_p,(ulong)(uVar10 + 1));
  }
  return __return_storage_ptr__;
}

Assistant:

cmInstallTargetGenerator::Files cmInstallTargetGenerator::GetFiles(
  std::string const& config) const
{
  Files files;

  cmStateEnums::TargetType targetType = this->Target->GetType();
  switch (targetType) {
    case cmStateEnums::EXECUTABLE:
      files.Type = cmInstallType_EXECUTABLE;
      break;
    case cmStateEnums::STATIC_LIBRARY:
      files.Type = cmInstallType_STATIC_LIBRARY;
      break;
    case cmStateEnums::SHARED_LIBRARY:
      files.Type = cmInstallType_SHARED_LIBRARY;
      break;
    case cmStateEnums::MODULE_LIBRARY:
      files.Type = cmInstallType_MODULE_LIBRARY;
      break;
    case cmStateEnums::INTERFACE_LIBRARY:
      // Not reachable. We never create a cmInstallTargetGenerator for
      // an INTERFACE_LIBRARY.
      assert(false &&
             "INTERFACE_LIBRARY targets have no installable outputs.");
      break;

    case cmStateEnums::OBJECT_LIBRARY: {
      // Compute all the object files inside this target
      std::vector<std::string> objects;
      this->Target->GetTargetObjectNames(config, objects);

      files.Type = cmInstallType_FILES;
      files.NoTweak = true;
      files.FromDir = this->Target->GetObjectDirectory(config);
      files.ToDir = computeInstallObjectDir(this->Target, config);
      for (std::string& obj : objects) {
        files.From.emplace_back(obj);
        files.To.emplace_back(std::move(obj));
      }
      return files;
    }

    case cmStateEnums::UTILITY:
    case cmStateEnums::GLOBAL_TARGET:
    case cmStateEnums::UNKNOWN_LIBRARY:
      this->Target->GetLocalGenerator()->IssueMessage(
        MessageType::INTERNAL_ERROR,
        "cmInstallTargetGenerator created with non-installable target.");
      return files;
  }

  // Compute the build tree directory from which to copy the target.
  std::string fromDirConfig;
  if (this->Target->NeedRelinkBeforeInstall(config)) {
    fromDirConfig =
      cmStrCat(this->Target->GetLocalGenerator()->GetCurrentBinaryDirectory(),
               "/CMakeFiles/CMakeRelink.dir/");
  } else {
    cmStateEnums::ArtifactType artifact = this->ImportLibrary
      ? cmStateEnums::ImportLibraryArtifact
      : cmStateEnums::RuntimeBinaryArtifact;
    fromDirConfig =
      cmStrCat(this->Target->GetDirectory(config, artifact), '/');
  }

  if (targetType == cmStateEnums::EXECUTABLE) {
    // There is a bug in cmInstallCommand if this fails.
    assert(this->NamelinkMode == NamelinkModeNone);

    cmGeneratorTarget::Names targetNames =
      this->Target->GetExecutableNames(config);
    if (this->ImportLibrary) {
      std::string from1 = fromDirConfig + targetNames.ImportLibrary;
      std::string to1 = targetNames.ImportLibrary;
      files.From.emplace_back(std::move(from1));
      files.To.emplace_back(std::move(to1));
      std::string targetNameImportLib;
      if (this->Target->GetImplibGNUtoMS(config, targetNames.ImportLibrary,
                                         targetNameImportLib)) {
        files.From.emplace_back(fromDirConfig + targetNameImportLib);
        files.To.emplace_back(targetNameImportLib);
      }

      // An import library looks like a static library.
      files.Type = cmInstallType_STATIC_LIBRARY;
    } else {
      std::string from1 = fromDirConfig + targetNames.Output;
      std::string to1 = targetNames.Output;

      // Handle OSX Bundles.
      if (this->Target->IsAppBundleOnApple()) {
        cmMakefile const* mf = this->Target->Target->GetMakefile();

        // Get App Bundle Extension
        std::string ext;
        if (cmValue p = this->Target->GetProperty("BUNDLE_EXTENSION")) {
          ext = *p;
        } else {
          ext = "app";
        }

        // Install the whole app bundle directory.
        files.Type = cmInstallType_DIRECTORY;
        files.UseSourcePermissions = true;
        from1 += ".";
        from1 += ext;

        // Tweaks apply to the binary inside the bundle.
        to1 += ".";
        to1 += ext;
        to1 += "/";
        if (!mf->PlatformIsAppleEmbedded()) {
          to1 += "Contents/MacOS/";
        }
        to1 += targetNames.Output;
      } else {
        // Tweaks apply to the real file, so list it first.
        if (targetNames.Real != targetNames.Output) {
          std::string from2 = fromDirConfig + targetNames.Real;
          std::string to2 = targetNames.Real;
          files.From.emplace_back(std::move(from2));
          files.To.emplace_back(std::move(to2));
        }
      }

      files.From.emplace_back(std::move(from1));
      files.To.emplace_back(std::move(to1));
    }
  } else {
    cmGeneratorTarget::Names targetNames =
      this->Target->GetLibraryNames(config);
    if (this->ImportLibrary) {
      // There is a bug in cmInstallCommand if this fails.
      assert(this->Target->Makefile->PlatformSupportsAppleTextStubs() ||
             this->ImportlinkMode == NamelinkModeNone);

      auto GNUToMS = [this, &config, &files,
                      &fromDirConfig](const std::string& lib) {
        std::string importLib;
        if (this->Target->GetImplibGNUtoMS(config, lib, importLib)) {
          files.From.emplace_back(fromDirConfig + importLib);
          files.To.emplace_back(importLib);
        }
      };

      computeFilesToInstall(
        files, this->ImportlinkMode, fromDirConfig, targetNames.ImportOutput,
        targetNames.ImportLibrary, targetNames.ImportReal, GNUToMS);

      // An import library looks like a static library.
      files.Type = cmInstallType_STATIC_LIBRARY;
    } else if (this->Target->IsFrameworkOnApple()) {
      // FIXME: In principle we should be able to
      //   assert(this->NamelinkMode == NamelinkModeNone);
      // but since the current install() command implementation checks
      // the FRAMEWORK property immediately instead of delaying until
      // generate time, it is possible for project code to set the
      // property after calling install().  In such a case, the install()
      // command will use the LIBRARY code path and create two install
      // generators, one for the namelink component (NamelinkModeOnly)
      // and one for the primary artifact component (NamelinkModeSkip).
      // Historically this was not diagnosed and resulted in silent
      // installation of a framework to the LIBRARY destination.
      // Retain that behavior and warn about the case.
      switch (this->NamelinkMode) {
        case NamelinkModeNone:
          // Normal case.
          break;
        case NamelinkModeOnly:
          // Assume the NamelinkModeSkip instance will warn and install.
          return files;
        case NamelinkModeSkip: {
          std::string e = "Target '" + this->Target->GetName() +
            "' was changed to a FRAMEWORK sometime after install().  "
            "This may result in the wrong install DESTINATION.  "
            "Set the FRAMEWORK property earlier.";
          this->Target->GetGlobalGenerator()->GetCMakeInstance()->IssueMessage(
            MessageType::AUTHOR_WARNING, e, this->GetBacktrace());
        } break;
      }

      // Install the whole framework directory.
      files.Type = cmInstallType_DIRECTORY;
      files.UseSourcePermissions = true;

      std::string from1 = fromDirConfig + targetNames.Output;
      from1 = cmSystemTools::GetFilenamePath(from1);

      // Tweaks apply to the binary inside the bundle.
      std::string to1 = targetNames.Real;

      files.From.emplace_back(std::move(from1));
      files.To.emplace_back(std::move(to1));
    } else if (this->Target->IsCFBundleOnApple()) {
      // Install the whole app bundle directory.
      files.Type = cmInstallType_DIRECTORY;
      files.UseSourcePermissions = true;

      std::string targetNameBase =
        targetNames.Output.substr(0, targetNames.Output.find('/'));

      std::string from1 = fromDirConfig + targetNameBase;
      std::string to1 = targetNames.Output;

      files.From.emplace_back(std::move(from1));
      files.To.emplace_back(std::move(to1));
    } else {
      computeFilesToInstall(files, this->NamelinkMode, fromDirConfig,
                            targetNames.Output, targetNames.SharedObject,
                            targetNames.Real);
    }
  }

  // If this fails the above code is buggy.
  assert(files.From.size() == files.To.size());

  return files;
}